

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

MidiFile * __thiscall smf::MidiFile::operator=(MidiFile *this,MidiFile *other)

{
  MidiFile *this_00;
  MidiEventList *this_01;
  MidiEventList *local_20;
  MidiFile *local_18;
  MidiFile *other_local;
  MidiFile *this_local;
  
  local_18 = other;
  other_local = this;
  std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator=
            (&this->m_events,&other->m_events);
  this->m_linkedEventsQ = (bool)(local_18->m_linkedEventsQ & 1);
  local_18->m_linkedEventsQ = false;
  std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::clear
            (&local_18->m_events);
  this_00 = local_18;
  this_01 = (MidiEventList *)operator_new(0x18);
  MidiEventList::MidiEventList(this_01);
  local_20 = this_01;
  std::vector<smf::MidiEventList*,std::allocator<smf::MidiEventList*>>::
  emplace_back<smf::MidiEventList*>
            ((vector<smf::MidiEventList*,std::allocator<smf::MidiEventList*>> *)this_00,&local_20);
  this->m_ticksPerQuarterNote = local_18->m_ticksPerQuarterNote;
  this->m_theTrackState = local_18->m_theTrackState;
  this->m_theTimeState = local_18->m_theTimeState;
  std::__cxx11::string::operator=
            ((string *)&this->m_readFileName,(string *)&local_18->m_readFileName);
  this->m_timemapvalid = (bool)(local_18->m_timemapvalid & 1);
  std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::operator=
            (&this->m_timemap,&local_18->m_timemap);
  this->m_rwstatus = (bool)(local_18->m_rwstatus & 1);
  return this;
}

Assistant:

MidiFile& MidiFile::operator=(MidiFile&& other) {
	m_events = std::move(other.m_events);
	m_linkedEventsQ = other.m_linkedEventsQ;
	other.m_linkedEventsQ = false;
	other.m_events.clear();
	other.m_events.emplace_back(new MidiEventList);
	m_ticksPerQuarterNote = other.m_ticksPerQuarterNote;
	m_theTrackState       = other.m_theTrackState;
	m_theTimeState        = other.m_theTimeState;
	m_readFileName        = other.m_readFileName;
	m_timemapvalid        = other.m_timemapvalid;
	m_timemap             = other.m_timemap;
	m_rwstatus            = other.m_rwstatus;
	return *this;
}